

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O1

void __thiscall OpenMD::Perturbations::Light::Light(Light *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__Light_00303ef8;
  this->initialized = false;
  this->doLight = false;
  this->doParticlePot = false;
  this->info_ = info;
  (this->khat_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->khat_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->khat_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->k_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->k_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->k_).super_Vector<double,_3U>.data_[2] = 0.0;
  memset(&this->jones_,0,0xa8);
  this->lightParams = info->simParams_->lightPars_;
  return;
}

Assistant:

Light::Light(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doLight {false},
      doParticlePot {false}, info_(info) {
    lightParams = info_->getSimParams()->getLightParameters();
  }